

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking.c
# Opt level: O0

_Bool blocking_tcp_connect(char *host,int port,int *fd)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *in_RDX;
  uint16_t in_SI;
  char *in_RDI;
  sockaddr_in addr;
  int sockfd;
  sockaddr local_34;
  int local_24;
  int *local_20;
  uint16_t local_14;
  char *local_10;
  _Bool local_1;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  local_14 = in_SI;
  local_24 = socket(2,1,0);
  if (local_24 == -1) {
    local_1 = false;
  }
  else {
    inet_pton(2,local_10,local_34.sa_data + 2);
    local_34.sa_family = 2;
    local_34.sa_data._0_2_ = htons(local_14);
    iVar1 = connect(local_24,&local_34,0x10);
    iVar3 = local_24;
    if (iVar1 == -1) {
      perror("connect()");
      close(local_24);
      local_1 = false;
    }
    else {
      uVar2 = fcntl(local_24,3,0);
      iVar3 = fcntl(iVar3,4,(ulong)(uVar2 | 0x800));
      if (iVar3 == -1) {
        perror("fcntl()");
        close(local_24);
        local_1 = false;
      }
      else {
        *local_20 = local_24;
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool blocking_tcp_connect(const char * host, int port, int * fd)
{
  int sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if(sockfd == -1) return false;
  
 
  struct sockaddr_in addr;

  inet_pton(AF_INET, host, &addr.sin_addr);
  addr.sin_family = AF_INET;
  addr.sin_port = htons(port);
  
  if( connect(sockfd, (struct sockaddr *)&addr, sizeof(struct sockaddr_in)) == -1)
  {
    perror("connect()");
    close(sockfd);
    return false;
  }
  if(fcntl(sockfd, F_SETFL, fcntl(sockfd, F_GETFL, 0) | O_NONBLOCK) == -1)
  {
    perror("fcntl()");
    close(sockfd);
    return false;
  }
  *fd = sockfd;
  return true;
}